

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_channel_push_snapshot
               (cali_id_t chn_id,int param_2,int n,cali_id_t *trigger_info_attr_list,
               cali_variant_t *trigger_info_val_list)

{
  bool bVar1;
  int *piVar2;
  Attribute AVar3;
  size_t n_00;
  SnapshotBuilder *rec;
  ChannelBody *chB;
  SnapshotView trigger_info_00;
  Variant *local_ce0;
  Attribute *local_cc8;
  undefined1 local_cb0 [8];
  Channel channel;
  FixedSizeSnapshotRecord<64UL> trigger_info;
  uint64_t local_678;
  int local_664;
  int local_660;
  int i;
  undefined1 local_658 [8];
  Variant data [64];
  Attribute local_248;
  Attribute attr [64];
  Caliper c;
  cali_variant_t *trigger_info_val_list_local;
  cali_id_t *trigger_info_attr_list_local;
  int n_local;
  int param_1_local;
  cali_id_t chn_id_local;
  
  trigger_info_attr_list_local._0_4_ = n;
  trigger_info_attr_list_local._4_4_ = param_2;
  _n_local = chn_id;
  cali::Caliper::Caliper((Caliper *)(attr + 0x3f));
  local_cc8 = &local_248;
  do {
    cali::Attribute::Attribute(local_cc8);
    local_cc8 = local_cc8 + 1;
  } while (local_cc8 != attr + 0x3f);
  local_ce0 = (Variant *)local_658;
  do {
    cali::Variant::Variant(local_ce0);
    local_ce0 = local_ce0 + 1;
  } while ((anon_union_8_7_33918203_for_value *)local_ce0 != &data[0x3f].m_v.value);
  i = 0;
  piVar2 = std::max<int>((int *)&trigger_info_attr_list_local,&i);
  local_660 = 0x40;
  piVar2 = std::min<int>(piVar2,&local_660);
  trigger_info_attr_list_local._0_4_ = *piVar2;
  for (local_664 = 0; local_664 < (int)trigger_info_attr_list_local; local_664 = local_664 + 1) {
    AVar3 = cali::Caliper::get_attribute((Caliper *)(attr + 0x3f),trigger_info_attr_list[local_664])
    ;
    attr[(long)local_664 + -1].m_node = AVar3.m_node;
    cali::Variant::Variant
              ((Variant *)&trigger_info.m_builder.m_skipped,trigger_info_val_list + local_664);
    data[(long)local_664 + -1].m_v.value.v_uint = trigger_info.m_builder.m_skipped;
    data[local_664].m_v.type_and_size = local_678;
  }
  cali::FixedSizeSnapshotRecord<64UL>::FixedSizeSnapshotRecord
            ((FixedSizeSnapshotRecord<64UL> *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  n_00 = (size_t)(int)trigger_info_attr_list_local;
  rec = cali::FixedSizeSnapshotRecord<64UL>::builder
                  ((FixedSizeSnapshotRecord<64UL> *)
                   &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  cali::Caliper::make_record
            ((Caliper *)(attr + 0x3f),n_00,&local_248,(Variant *)local_658,rec,(Node *)0x0);
  cali::Caliper::get_channel((Caliper *)local_cb0,(cali_id_t)(attr + 0x3f));
  bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_cb0);
  if ((bVar1) && (bVar1 = cali::Channel::is_active((Channel *)local_cb0), bVar1)) {
    chB = cali::Channel::body((Channel *)local_cb0);
    trigger_info_00 =
         cali::FixedSizeSnapshotRecord<64UL>::view
                   ((FixedSizeSnapshotRecord<64UL> *)
                    &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    cali::Caliper::push_snapshot((Caliper *)(attr + 0x3f),chB,trigger_info_00);
  }
  cali::Channel::~Channel((Channel *)local_cb0);
  cali::Caliper::~Caliper((Caliper *)(attr + 0x3f));
  return;
}

Assistant:

void cali_channel_push_snapshot(
    cali_id_t chn_id,
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    Channel channel = c.get_channel(chn_id);

    if (channel && channel.is_active())
        c.push_snapshot(channel.body(), trigger_info.view());
}